

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::InferredValueFunction::~InferredValueFunction(InferredValueFunction *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x40);
  return;
}

Assistant:

InferredValueFunction(KnownSystemName knownNameId, bool isClockFunc) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isClockFunc(isClockFunc) {}